

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O2

vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *
METADemuxer::mergePlayItems
          (vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *__return_storage_ptr__,
          vector<MPLSParser,_std::allocator<MPLSParser>_> *mplsInfoList)

{
  pointer pMVar1;
  pointer pMVar2;
  MPLSPlayItem *j;
  pointer __x;
  MPLSParser *i;
  pointer pMVar3;
  
  (__return_storage_ptr__->super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pMVar1 = (mplsInfoList->super__Vector_base<MPLSParser,_std::allocator<MPLSParser>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pMVar3 = (mplsInfoList->super__Vector_base<MPLSParser,_std::allocator<MPLSParser>_>)._M_impl.
                super__Vector_impl_data._M_start; pMVar3 != pMVar1; pMVar3 = pMVar3 + 1) {
    pMVar2 = (pMVar3->m_playItems).super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (__x = (pMVar3->m_playItems).super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>
               ._M_impl.super__Vector_impl_data._M_start; __x != pMVar2; __x = __x + 1) {
      std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::push_back
                (__return_storage_ptr__,__x);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<MPLSPlayItem> METADemuxer::mergePlayItems(const std::vector<MPLSParser>& mplsInfoList)
{
    std::vector<MPLSPlayItem> result;
    for (auto& i : mplsInfoList)
    {
        for (auto& j : i.m_playItems) result.push_back(j);
    }
    return result;
}